

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

Mat4 * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::getInputValue<2,13>
          (Mat4 *__return_storage_ptr__,MatrixCaseUtils *this,ShaderEvalContext *evalCtx,
          int inputNdx)

{
  int inputNdx_local;
  ShaderEvalContext *evalCtx_local;
  Mat4 *m;
  
  tcu::Matrix<float,_4,_4>::Matrix(__return_storage_ptr__);
  tcu::Matrix<float,_4,_4>::setColumn(__return_storage_ptr__,0,(Vector<float,_4> *)(this + 0x30));
  tcu::Matrix<float,_4,_4>::setColumn(__return_storage_ptr__,1,(Vector<float,_4> *)(this + 0x40));
  tcu::Matrix<float,_4,_4>::setColumn(__return_storage_ptr__,2,(Vector<float,_4> *)(this + 0x50));
  tcu::Matrix<float,_4,_4>::setColumn(__return_storage_ptr__,3,(Vector<float,_4> *)(this + 0x60));
  return __return_storage_ptr__;
}

Assistant:

inline tcu::Mat4 getInputValue<INPUTTYPE_DYNAMIC, TYPE_FLOAT_MAT4> (const ShaderEvalContext& evalCtx, int inputNdx)
{
	DE_UNREF(inputNdx); // Not used.
	tcu::Mat4 m;
	m.setColumn(0, evalCtx.in[0]);
	m.setColumn(1, evalCtx.in[1]);
	m.setColumn(2, evalCtx.in[2]);
	m.setColumn(3, evalCtx.in[3]);
	return m;
}